

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O1

void __thiscall duckdb::ColumnScanState::Next(ColumnScanState *this,idx_t count)

{
  pointer pCVar1;
  ColumnScanState *child_state;
  pointer this_00;
  
  NextInternal(this,count);
  pCVar1 = (this->child_states).
           super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
           super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->child_states).
                 super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
                 super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1
      ) {
    Next(this_00,count);
  }
  return;
}

Assistant:

void ColumnScanState::Next(idx_t count) {
	NextInternal(count);
	for (auto &child_state : child_states) {
		child_state.Next(count);
	}
}